

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O0

void __thiscall Am_Object::Remove_Constraint(Am_Object *this,Am_Slot_Key key)

{
  bool bVar1;
  int iVar2;
  Am_Slot_Data *in_data;
  Am_Constraint *proto;
  undefined4 extraout_var;
  Am_Slot local_50;
  Am_Slot local_48;
  undefined1 local_40 [8];
  Am_Constraint_Iterator iter;
  Am_Constraint_Tag tag;
  Am_Constraint *constraint;
  Am_Slot_Data *slot;
  Am_Slot_Key key_local;
  Am_Object *this_local;
  
  if (this->data != (Am_Object_Data *)0x0) {
    in_data = Am_Object_Data::find_slot(this->data,key);
    if ((in_data != (Am_Slot_Data *)0x0) && (in_data->context == this->data)) {
      Am_Slot::Am_Slot(&local_48,in_data);
      Am_Constraint_Iterator::Am_Constraint_Iterator((Am_Constraint_Iterator *)local_40,&local_48);
      Am_Constraint_Iterator::Start((Am_Constraint_Iterator *)local_40);
      while (bVar1 = Am_Constraint_Iterator::Last((Am_Constraint_Iterator *)local_40),
            ((bVar1 ^ 0xffU) & 1) != 0) {
        proto = Am_Constraint_Iterator::Get((Am_Constraint_Iterator *)local_40);
        iter.current = (Am_Constraint_Iterator_Data *)
                       Am_Constraint_Iterator::Get_Tag((Am_Constraint_Iterator *)local_40);
        Am_Constraint_Iterator::Next((Am_Constraint_Iterator *)local_40);
        iVar2 = (*(proto->super_Am_Registered_Type)._vptr_Am_Registered_Type[10])();
        if (CONCAT44(extraout_var,iVar2) == 0) {
          if ((*(ushort *)&in_data->field_0x38 >> 8 & 3) == 1) {
            Am_Object_Data::prop_remove_constraint(this->data,key,proto);
          }
          Am_Slot::Am_Slot(&local_50,in_data);
          Am_Slot::Remove_Constraint(&local_50,iter.current);
        }
      }
    }
    return;
  }
  Am_Error("** Remove_Constraint called on a (0L) object");
}

Assistant:

void
Am_Object::Remove_Constraint(Am_Slot_Key key)
{
  if (!data)
    Am_Error("** Remove_Constraint called on a (0L) object");
  Am_Slot_Data *slot = data->find_slot(key);
  if (slot && slot->context == data) {
    Am_Constraint *constraint;
    Am_Constraint_Tag tag;
    Am_Constraint_Iterator iter((const Am_Slot &)slot);
    iter.Start();
    while (!iter.Last()) {
      constraint = iter.Get();
      tag = iter.Get_Tag();
      iter.Next();
      if (constraint->Get_Prototype() == nullptr) {
        if (slot->rule == Am_INHERIT)
          data->prop_remove_constraint(key, constraint);
        Am_Slot(slot).Remove_Constraint(tag);
      }
    }
  }
}